

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseEncodingSynapse.cpp
# Opt level: O2

void __thiscall TemporalPhaseEncodingSynapse::update(TemporalPhaseEncodingSynapse *this)

{
  VectorXd *this_00;
  double dVar1;
  Population *pPVar2;
  int iVar3;
  Scalar *pSVar4;
  SpikeEvent *this_01;
  Event *this_02;
  int j;
  ulong uVar5;
  long index;
  double dVar6;
  double dVar7;
  
  this_00 = &this->spikeTimes;
  iVar3 = 0;
  do {
    if (this->inputSize <= iVar3) {
      return;
    }
    resetOutput(this);
    for (uVar5 = 0;
        (long)uVar5 <
        (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows; uVar5 = uVar5 + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          uVar5);
      dVar1 = *pSVar4;
      dVar6 = Clock::getCurrentTime(this->clock);
      if (dVar6 < dVar1) {
LAB_0011fa31:
        this_02 = (Event *)operator_new(0x18);
        NoEvent::NoEvent((NoEvent *)this_02);
        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = this_02;
      }
      else {
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            uVar5);
        if (*pSVar4 <= -1.0) goto LAB_0011fa31;
        this_01 = (SpikeEvent *)operator_new(0x28);
        SpikeEvent::SpikeEvent(this_01);
        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = (Event *)this_01;
        (**(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar5]->_vptr_Event)(0x4094500000000000);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            uVar5);
        *pSVar4 = -1.0;
      }
      pPVar2 = (this->super_Synapse).to_population;
      (*pPVar2->_vptr_Population[5])
                (pPVar2,uVar5 & 0xffffffff,
                 (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5]);
      Logging::logEvent(this->logger,(long)this,(int)uVar5,
                        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar5]->type);
    }
    dVar1 = this->currentWindow;
    dVar6 = Clock::getCurrentTime(this->clock);
    if (dVar1 <= dVar6) {
      for (index = 0;
          index < (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows; index = index + 1) {
        dVar1 = this->param->window_length_s;
        dVar7 = (double)this->param->som_frequency;
        dVar6 = round(((double)(((this->super_Synapse).from_population)->output).
                               super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                               super__Vector_impl_data._M_start[index][1]._vptr_Event * 0.8 + 0.1) *
                      dVar1 * dVar7);
        dVar7 = dVar6 / dVar7 + this->phaseOffset;
        dVar6 = dVar1 * 0.9;
        if (dVar7 <= dVar1 * 0.9) {
          dVar6 = dVar7;
        }
        uVar5 = -(ulong)(dVar7 < dVar1 * 0.0);
        dVar7 = this->currentWindow;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        *pSVar4 = (double)(~uVar5 & (ulong)dVar6 | (ulong)(dVar1 * 0.0) & uVar5) + dVar7;
      }
      this->currentWindow = this->param->window_length_s + this->currentWindow;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void TemporalPhaseEncodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        resetOutput();
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) <= clock->getCurrentTime() && spikeTimes(j) > -1) {
                output[j] = new SpikeEvent();
                output[j]->setWeight(1300.0);
                spikeTimes(j) = -1;
            }
            else {
                output[j] = new NoEvent();
            }
            to_population->setInput(j, output[j]);
            logger->logEvent((long)this, j, output[j]->type);
        }
        if(currentWindow <= clock->getCurrentTime()) {
            for(int j = 0; j < spikeTimes.size(); j++) {
                double scaledValue = 0.1 + static_cast<ValueEvent*>(from_population->output[j])->value * 0.8;
                double vs = scaledValue * param->window_length_s;
                double bin = round(vs * param->som_frequency);
                spikeTimes(j) = currentWindow + helperFunctions::clamp(bin / param->som_frequency + phaseOffset, 0*param->window_length_s, param->window_length_s*0.9);

                // double spikeTime = floor(static_cast<ValueEvent*>(from_population->output[j])->value * param->som_frequency) * phaseStep +param->som_phase;
                // spikeTimes(j) = currentWindow + helperFunctions::clamp((spikeTime * 0.8), 0, 0.9*param->window_length_s);
            }
            currentWindow += param->window_length_s;
        }
    }
}